

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uchriter.cpp
# Opt level: O3

UChar32 __thiscall icu_63::UCharCharacterIterator::next32(UCharCharacterIterator *this)

{
  char16_t cVar1;
  int iVar2;
  int iVar3;
  char16_t *pcVar4;
  uint uVar5;
  int iVar6;
  
  iVar2 = (this->super_CharacterIterator).pos;
  iVar3 = (this->super_CharacterIterator).end;
  if (iVar2 < iVar3) {
    pcVar4 = this->text;
    iVar6 = iVar2 + 1;
    (this->super_CharacterIterator).pos = iVar6;
    if ((((pcVar4[iVar2] & 0xfc00U) == 0xd800) && (iVar6 != iVar3)) &&
       ((pcVar4[(long)iVar2 + 1] & 0xfc00U) == 0xdc00)) {
      iVar6 = iVar2 + 2;
      (this->super_CharacterIterator).pos = iVar6;
    }
    if (iVar6 < iVar3) {
      cVar1 = pcVar4[iVar6];
      uVar5 = (uint)(ushort)cVar1;
      if ((((cVar1 & 0xfc00U) == 0xd800) && (iVar6 + 1 != iVar3)) &&
         (((ushort)pcVar4[iVar6 + 1] & 0xfc00) == 0xdc00)) {
        uVar5 = (uint)(ushort)cVar1 * 0x400 + (uint)(ushort)pcVar4[iVar6 + 1] + 0xfca02400;
      }
      return uVar5;
    }
  }
  (this->super_CharacterIterator).pos = iVar3;
  return 0xffff;
}

Assistant:

UChar32
UCharCharacterIterator::next32() {
    if (pos < end) {
        U16_FWD_1(text, pos, end);
        if(pos < end) {
            int32_t i = pos;
            UChar32 c;
            U16_NEXT(text, i, end, c);
            return c;
        }
    }
    /* make current() return DONE */
    pos = end;
    return DONE;
}